

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall pybind11::cpp_function::strdup_guard::~strdup_guard(strdup_guard *this)

{
  pointer ppcVar1;
  vector<char_*,_std::allocator<char_*>_> *__range2;
  pointer ppcVar2;
  
  ppcVar1 = (this->strings).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar2 = (this->strings).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar2 != ppcVar1; ppcVar2 = ppcVar2 + 1) {
    free(*ppcVar2);
  }
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            ((_Vector_base<char_*,_std::allocator<char_*>_> *)this);
  return;
}

Assistant:

~strdup_guard() {
            for (auto s : strings)
                std::free(s);
        }